

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hh
# Opt level: O2

vector<double,_std::allocator<double>_> *
randvector(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> *__range1;
  double *x;
  pointer pdVar2;
  double dVar3;
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)n,&local_19);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    dVar3 = randdouble();
    *pdVar2 = dVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> randvector(int n) {
	vector<double> v(n);
	for (double& x : v) x = randdouble();
	return v;
}